

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat2.c
# Opt level: O2

int Cbs2_ManAnalyze(Cbs2_Man_t *p,int Level,int iVar,int iFan0,int iFan1)

{
  Cbs2_Que_t *p_00;
  uint Plus;
  int iVar1;
  int iVar2;
  ulong uVar3;
  int *piVar4;
  
  iVar1 = Cbs2_VarIsAssigned(p,iVar);
  if (iVar1 == 0) {
    __assert_fail("Cbs2_VarIsAssigned(p, iVar)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat2.c"
                  ,0x310,"int Cbs2_ManAnalyze(Cbs2_Man_t *, int, int, int, int)");
  }
  if ((p->pClauses).iHead != (p->pClauses).iTail) {
    __assert_fail("Cbs2_QueIsEmpty( pQue )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat2.c"
                  ,0x311,"int Cbs2_ManAnalyze(Cbs2_Man_t *, int, int, int, int)");
  }
  p_00 = &p->pClauses;
  Cbs2_QuePush(p_00,0);
  Cbs2_QuePush(p_00,0);
  if (iFan0 == 0) {
    if (iFan1 == 0) {
      __assert_fail("iFan1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat2.c"
                    ,800,"int Cbs2_ManAnalyze(Cbs2_Man_t *, int, int, int, int)");
    }
    Plus = (p->pClauses).pData[iFan1];
    Cbs2_QueGrow(p_00,Plus);
    piVar4 = (p->pClauses).pData;
    iVar1 = Abc_Lit2Var(piVar4[(long)iFan1 + 1]);
    if (iVar1 != iVar) {
      __assert_fail("iVar == Abc_Lit2Var(pLits[0])",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat2.c"
                    ,0x323,"int Cbs2_ManAnalyze(Cbs2_Man_t *, int, int, int, int)");
    }
    piVar4 = piVar4 + (long)iFan1 + 1;
    iVar1 = Cbs2_VarValue(p,iVar);
    iVar2 = Abc_LitIsCompl(*piVar4);
    if (iVar1 != iVar2) {
      __assert_fail("Cbs2_VarValue(p, iVar) == Abc_LitIsCompl(pLits[0])",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat2.c"
                    ,0x324,"int Cbs2_ManAnalyze(Cbs2_Man_t *, int, int, int, int)");
    }
    uVar3 = 0;
    if ((int)Plus < 1) {
      Plus = 0;
    }
    for (; Plus != uVar3; uVar3 = uVar3 + 1) {
      iVar1 = Abc_Lit2Var(piVar4[uVar3]);
      Cbs2_QuePush(p_00,iVar1);
    }
  }
  else {
    iVar1 = Cbs2_VarIsAssigned(p,iFan0);
    if (iVar1 == 0) {
      __assert_fail("Cbs2_VarIsAssigned(p, iFan0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat2.c"
                    ,0x316,"int Cbs2_ManAnalyze(Cbs2_Man_t *, int, int, int, int)");
    }
    iVar1 = iFan0;
    if (iFan1 != 0) {
      iVar1 = Cbs2_VarIsAssigned(p,iFan1);
      if (iVar1 == 0) {
        __assert_fail("iFan1 == 0 || Cbs2_VarIsAssigned(p, iFan1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat2.c"
                      ,0x317,"int Cbs2_ManAnalyze(Cbs2_Man_t *, int, int, int, int)");
      }
      Cbs2_QuePush(p_00,iVar);
      iVar1 = iFan1;
      iVar = iFan0;
    }
    Cbs2_QuePush(p_00,iVar);
    Cbs2_QuePush(p_00,iVar1);
  }
  iVar1 = Cbs2_ManDeriveReason(p,Level);
  return iVar1;
}

Assistant:

static inline int Cbs2_ManAnalyze( Cbs2_Man_t * p, int Level, int iVar, int iFan0, int iFan1 )
{
    Cbs2_Que_t * pQue = &(p->pClauses); 
    assert( Cbs2_VarIsAssigned(p, iVar) );
    assert( Cbs2_QueIsEmpty( pQue ) );
    Cbs2_QuePush( pQue, 0 );
    Cbs2_QuePush( pQue, 0 );
    if ( iFan0 ) // circuit conflict
    {
        assert( Cbs2_VarIsAssigned(p, iFan0) );
        assert( iFan1 == 0 || Cbs2_VarIsAssigned(p, iFan1) );
        Cbs2_QuePush( pQue, iVar );
        Cbs2_QuePush( pQue, iFan0 );
        if ( iFan1 )
        Cbs2_QuePush( pQue, iFan1 );
    }
    else // clause conflict
    {
        int i, * pLits, nLits = Cbs2_ClauseSize( p, iFan1 );
        assert( iFan1 );
        Cbs2_QueGrow( pQue, nLits );
        pLits = Cbs2_ClauseLits( p, iFan1 );
        assert( iVar == Abc_Lit2Var(pLits[0]) );
        assert( Cbs2_VarValue(p, iVar) == Abc_LitIsCompl(pLits[0]) );
        for ( i = 0; i < nLits; i++ )
            Cbs2_QuePush( pQue, Abc_Lit2Var(pLits[i]) );
    }
    return Cbs2_ManDeriveReason( p, Level );
}